

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

int __thiscall Js::InterpreterStackFrame::ProcessFinally(InterpreterStackFrame *this)

{
  bool bVar1;
  Var pvVar2;
  int local_14;
  int newOffset;
  InterpreterStackFrame *this_local;
  
  *(short *)(this + 0xe4) = *(short *)(this + 0xe4) + 1;
  bVar1 = IsInDebugMode(this);
  if (bVar1) {
    pvVar2 = DebugProcess(this);
    local_14 = ::Math::PointerCastToIntegral<int>(pvVar2);
  }
  else {
    pvVar2 = Process(this);
    local_14 = ::Math::PointerCastToIntegral<int>(pvVar2);
  }
  return local_14;
}

Assistant:

int InterpreterStackFrame::ProcessFinally()
    {
        this->nestedFinallyDepth++;

        int newOffset = 0;
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->DebugProcess());
        }
        else
#endif
        {
            newOffset = ::Math::PointerCastToIntegral<int>(this->Process());
        }

        return newOffset;
    }